

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_set.hpp
# Opt level: O1

const_iterator * __thiscall
pstore::index::
hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
::find<pstore::indirect_string,void>
          (const_iterator *__return_storage_ptr__,void *this,database *db,indirect_string *key)

{
  const_iterator local_100;
  
  hamt_map<pstore::indirect_string,pstore::index::details::empty_class,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
  ::find<pstore::indirect_string,void>
            (&local_100,
             (hamt_map<pstore::indirect_string,pstore::index::details::empty_class,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
              *)((long)this + 8),db,key);
  (__return_storage_ptr__->it_).db_ = local_100.db_;
  memcpy(&(__return_storage_ptr__->it_).visited_parents_,&local_100.visited_parents_,0xd8);
  (__return_storage_ptr__->it_).index_ = local_100.index_;
  (__return_storage_ptr__->it_).pos_._M_t.
  super___uniq_ptr_impl<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
  .
  super__Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
  ._M_head_impl = (pair<const_pstore::indirect_string,_pstore::index::details::empty_class> *)0x0;
  if ((_Tuple_impl<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
       )local_100.pos_._M_t.
        super___uniq_ptr_impl<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
        .
        super__Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
        ._M_head_impl !=
      (pair<const_pstore::indirect_string,_pstore::index::details::empty_class> *)0x0) {
    operator_delete((void *)local_100.pos_._M_t.
                            super___uniq_ptr_impl<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
                            .
                            super__Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
                            ._M_head_impl,0x20);
  }
  return __return_storage_ptr__;
}

Assistant:

const_iterator find (database const & db, OtherKeyType const & key) const {
                return const_iterator{map_.find (db, key)};
            }